

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

void __thiscall
binlog::SessionWriter::SessionWriter
          (SessionWriter *this,Session *session,size_t queueCapacity,uint64_t id,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char *pcVar3;
  pthread_mutex_t *__mutex;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar5;
  undefined8 uVar6;
  pthread_mutex_t *__mutex_00;
  pthread_mutex_t *ppVar7;
  pthread_mutex_t *local_98;
  undefined1 local_88 [32];
  pthread_mutex_t local_68;
  __pthread_internal_list local_40;
  undefined8 local_30;
  
  this->_session = session;
  local_68._16_8_ = 0;
  local_68.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_40.__prev._0_1_ = 0;
  local_30 = 0;
  local_68.__data.__list.__prev = &local_40;
  Session::createChannel((Session *)&this->_channel,(size_t)session,(WriterProp *)queueCapacity);
  if (local_68.__data.__list.__prev != &local_40) {
    operator_delete(local_68.__data.__list.__prev,
                    CONCAT71(local_40.__prev._1_7_,local_40.__prev._0_1_) + 1);
  }
  ppVar7 = (pthread_mutex_t *)
           (this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = *(long *)((long)ppVar7 + 0x30);
  (this->_qw)._queue = (Queue *)(lVar2 + 0x10);
  pcVar3 = *(char **)(lVar2 + 0x28);
  (this->_qw)._writePos = pcVar3;
  (this->_qw)._writeEnd = pcVar3;
  if (id != 0) {
    __mutex_00 = (pthread_mutex_t *)this->_session;
    iVar5 = pthread_mutex_lock(__mutex_00);
    if (iVar5 != 0) {
      iVar5 = std::__throw_system_error(iVar5);
      goto LAB_0010473f;
    }
    ppVar7->__align = id;
    pthread_mutex_unlock(__mutex_00);
  }
  local_88._24_8_ = name->_M_string_length;
  if ((__pthread_internal_list *)local_88._24_8_ != (__pthread_internal_list *)0x0) {
    __mutex_00 = (pthread_mutex_t *)local_88;
    local_98 = (pthread_mutex_t *)(name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if (local_98 == (pthread_mutex_t *)paVar1) {
      local_88._0_8_ = paVar1->_M_allocated_capacity;
      local_88._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
      local_98 = __mutex_00;
    }
    else {
      local_88._0_8_ = paVar1->_M_allocated_capacity;
    }
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    __mutex = (pthread_mutex_t *)this->_session;
    peVar4 = (this->_channel).
             super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ppVar7 = &local_68;
    if (local_98 == __mutex_00) {
      local_68._8_8_ = local_88._8_8_;
      local_88._16_8_ = ppVar7;
    }
    else {
      local_88._16_8_ = local_98;
    }
    local_68.__data._0_8_ = local_88._0_8_;
    local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
    iVar5 = pthread_mutex_lock(__mutex);
    local_98 = __mutex_00;
    if (iVar5 != 0) {
LAB_0010473f:
      uVar6 = std::__throw_system_error(iVar5);
      if ((pthread_mutex_t *)local_88._16_8_ != ppVar7) {
        operator_delete((void *)local_88._16_8_,(ulong)(local_68.__data._0_8_ + 1));
      }
      if (local_98 != __mutex_00) {
        operator_delete(local_98,local_88._0_8_ + 1);
      }
      this_00 = (this->_channel).
                super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      _Unwind_Resume(uVar6);
    }
    std::__cxx11::string::operator=
              ((string *)&(peVar4->writerProp).name,(string *)(local_88 + 0x10));
    pthread_mutex_unlock(__mutex);
    if ((pthread_mutex_t *)local_88._16_8_ != ppVar7) {
      operator_delete((void *)local_88._16_8_,(ulong)(local_68.__data._0_8_ + 1));
    }
  }
  return;
}

Assistant:

inline SessionWriter::SessionWriter(Session& session, std::size_t queueCapacity, std::uint64_t id, std::string name)
  :_session(& session),
   _channel(session.createChannel(queueCapacity)),
   _qw(_channel->queue())
{
  if (id != 0) { setId(id); }
  if (! name.empty()) { setName(std::move(name)); }
}